

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcProject::IfcProject(IfcProject *this)

{
  *(undefined ***)&this->field_0x150 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x158 = 0;
  *(char **)&this->field_0x160 = "IfcProject";
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__007907b0);
  *(undefined8 *)&(this->super_IfcObject).field_0xd8 = 0;
  *(undefined8 *)&this->super_IfcObject = 0x7906f8;
  *(undefined8 *)&this->field_0x150 = 0x790798;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x790720;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x790748;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0x790770;
  *(undefined1 **)&(this->super_IfcObject).field_0xe0 = &this->field_0xf0;
  *(undefined8 *)&this->field_0xe8 = 0;
  this->field_0xf0 = 0;
  this->field_0x100 = 0;
  (this->Phase).ptr._M_dataplus._M_p = (pointer)&(this->Phase).ptr.field_2;
  (this->Phase).ptr._M_string_length = 0;
  (this->Phase).ptr.field_2._M_local_buf[0] = '\0';
  (this->Phase).have = false;
  (this->RepresentationContexts).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RepresentationContexts).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RepresentationContexts).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UnitsInContext).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcProject() : Object("IfcProject") {}